

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O1

Boxed_Number __thiscall
chaiscript::Boxed_Number::assign_shift_right
          (Boxed_Number *this,Boxed_Number *t_lhs,Boxed_Number *t_rhs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  Boxed_Number BVar2;
  Boxed_Number BStack_38;
  anon_class_24_3_1b4046b4 local_28;
  
  local_28.t_oper = assign_shift_right;
  local_28.t_lhs = &t_lhs->bv;
  local_28.t_rhs = &t_rhs->bv;
  visit<chaiscript::Boxed_Number::oper(chaiscript::Operators::Opers,chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&)::_lambda(auto:1_const&)_1_&>
            (&BStack_38,&t_lhs->bv,&local_28);
  Boxed_Number(this,&BStack_38.bv);
  _Var1._M_pi = extraout_RDX;
  if (BStack_38.bv.m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (BStack_38.bv.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  BVar2.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar2.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Boxed_Number)
         BVar2.bv.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Number assign_shift_right(Boxed_Number t_lhs, const Boxed_Number &t_rhs) {
      return Boxed_Number(oper(Operators::Opers::assign_shift_right, t_lhs.bv, t_rhs.bv));
    }